

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

void charaff_from_obj_index(OBJ_INDEX_DATA *obj,AFFECT_DATA *paf)

{
  AFFECT_DATA *pAVar1;
  AFFECT_DATA *pAVar2;
  string_view fmt;
  string_view fmt_00;
  
  pAVar1 = obj->charaffs;
  if (pAVar1 == (AFFECT_DATA *)0x0) {
    fmt_00._M_str = "charaff_from_obj_index: no affect.";
    fmt_00._M_len = 0x22;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
    return;
  }
  if (pAVar1 == paf) {
    obj->charaffs = paf->next;
  }
  else {
    do {
      pAVar2 = pAVar1;
      if (pAVar2 == (AFFECT_DATA *)0x0) goto LAB_002a8ff0;
      pAVar1 = pAVar2->next;
    } while (pAVar2->next != paf);
    pAVar2->next = paf->next;
    if (pAVar2 == (AFFECT_DATA *)0x0) {
LAB_002a8ff0:
      fmt._M_str = "charaff_from_obj_index: cannot find paf.";
      fmt._M_len = 0x28;
      CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
      return;
    }
  }
  free_affect(paf);
  return;
}

Assistant:

void charaff_from_obj_index(OBJ_INDEX_DATA *obj, AFFECT_DATA *paf)
{
	if (obj->charaffs == nullptr)
	{
		RS.Logger.Warn("charaff_from_obj_index: no affect.");
		return;
	}

	if (paf == obj->charaffs)
	{
		obj->charaffs = paf->next;
	}
	else
	{
		AFFECT_DATA *prev;
		for (prev = obj->charaffs; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("charaff_from_obj_index: cannot find paf.");
			return;
		}
	}

	free_affect(paf);
}